

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::BuildHandlerScope
               (Var argThis,RecyclableObject *hostObject,FrameDisplay *pDisplay,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptNumberObject *item;
  Var pvVar4;
  Recycler *alloc;
  FrameDisplay *pFVar5;
  ushort uVar6;
  undefined1 local_70 [8];
  TrackAllocData data;
  uint16 local_32;
  
  data._32_8_ = hostObject;
  if (argThis == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b5e,"(argThis != nullptr)","argThis != nullptr");
    if (!bVar2) goto LAB_009a46cd;
    *puVar3 = 0;
  }
  bVar2 = TaggedNumber::Is(argThis);
  if (bVar2) {
    item = JavascriptLibrary::CreateNumberObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,argThis);
  }
  else {
    item = (JavascriptNumberObject *)ToUnscopablesWrapperObject(argThis,scriptContext);
  }
  FrameDisplay::SetItem(pDisplay,0,item);
  local_32 = pDisplay->length;
  uVar6 = 1;
  while ((argThis != (Var)0x0 &&
         (pvVar4 = (Var)(**(code **)(*(long *)data._32_8_ + 0x270))(data._32_8_,argThis),
         pvVar4 != (Var)0x0))) {
    argThis = CrossSite::MarshalVar(scriptContext,pvVar4,false);
    if (uVar6 == local_32) {
      local_32 = UInt16Math::Add(local_32,8);
      data.typeinfo = (type_info *)(ulong)((uint)local_32 * 8);
      local_70 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4d342ea;
      data.filename._0_4_ = 0x1b73;
      alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
      pFVar5 = (FrameDisplay *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
      pFVar5->tag = true;
      pFVar5->strictMode = false;
      pFVar5->length = local_32;
      pFVar5->unused = 0;
      js_memcpy_s(pFVar5 + 1,(ulong)pFVar5->length << 3,pDisplay + 1,(ulong)pDisplay->length << 3);
      pDisplay = pFVar5;
    }
    pvVar4 = ToUnscopablesWrapperObject(argThis,scriptContext);
    FrameDisplay::SetItem(pDisplay,(uint)uVar6,pvVar4);
    uVar6 = uVar6 + 1;
  }
  if (pDisplay->length < uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b7f,"(i <= pDisplay->GetLength())","i <= pDisplay->GetLength()")
    ;
    if (!bVar2) {
LAB_009a46cd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDisplay->length = uVar6;
  return;
}

Assistant:

void JavascriptOperators::BuildHandlerScope(Var argThis, RecyclableObject * hostObject, FrameDisplay * pDisplay, ScriptContext * scriptContext)
    {
        // Event handlers need implicit lookups of @@unscopables on parent scopes.
        // We can intercept the property accesses by wrapping the object with the unscopables handler.
        // WebIDL: https://heycam.github.io/webidl/#ref-for-Unscopable

        Assert(argThis != nullptr);
        pDisplay->SetItem(0, TaggedNumber::Is(argThis) ? scriptContext->GetLibrary()->CreateNumberObject(argThis) : ToUnscopablesWrapperObject(argThis, scriptContext));
        uint16 i = 1;

        Var aChild = argThis;
        uint16 length = pDisplay->GetLength();

        // Now add any parent scopes
        // We need to support the namespace parent lookup in both fastDOM on and off scenario.
        while (aChild != NULL)
        {
            Var aParent = hostObject->GetNamespaceParent(aChild);

            if (aParent == nullptr)
            {
                break;
            }
            aParent = CrossSite::MarshalVar(scriptContext, aParent);
            if (i == length)
            {
                length = UInt16Math::Add(length, 8);
                FrameDisplay * tmp = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                js_memcpy_s((char*)tmp + tmp->GetOffsetOfScopes(), tmp->GetLength() * sizeof(void *), (char*)pDisplay + pDisplay->GetOffsetOfScopes(), pDisplay->GetLength() * sizeof(void*));
                pDisplay = tmp;
            }

            Var aParentWrapped = ToUnscopablesWrapperObject(aParent, scriptContext);
            pDisplay->SetItem(i, aParentWrapped);

            aChild = aParent;
            i++;
        }

        Assert(i <= pDisplay->GetLength());
        pDisplay->SetLength(i);
    }